

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<long>::Resize(RepeatedField<long> *this,int new_size,long *value)

{
  long lVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if (this->current_size_ < new_size) {
    Reserve(this,new_size);
    auVar4 = _DAT_0024e950;
    auVar3 = _DAT_0024e940;
    lVar6 = (long)this->current_size_;
    if (this->current_size_ != new_size) {
      lVar1 = *value;
      pvVar2 = this->arena_or_elements_;
      uVar5 = ((long)new_size * 8 + lVar6 * -8) - 8;
      auVar10._8_4_ = (int)uVar5;
      auVar10._0_8_ = uVar5;
      auVar10._12_4_ = (int)(uVar5 >> 0x20);
      auVar8._0_8_ = uVar5 >> 3;
      auVar8._8_8_ = auVar10._8_8_ >> 3;
      uVar7 = 0;
      auVar8 = auVar8 ^ _DAT_0024e950;
      do {
        auVar9._8_4_ = (int)uVar7;
        auVar9._0_8_ = uVar7;
        auVar9._12_4_ = (int)(uVar7 >> 0x20);
        auVar10 = (auVar9 | auVar3) ^ auVar4;
        if ((bool)(~(auVar10._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar10._0_4_ ||
                    auVar8._4_4_ < auVar10._4_4_) & 1)) {
          *(long *)((long)pvVar2 + uVar7 * 8 + lVar6 * 8) = lVar1;
        }
        if ((auVar10._12_4_ != auVar8._12_4_ || auVar10._8_4_ <= auVar8._8_4_) &&
            auVar10._12_4_ <= auVar8._12_4_) {
          *(long *)((long)pvVar2 + uVar7 * 8 + lVar6 * 8 + 8) = lVar1;
        }
        uVar7 = uVar7 + 2;
      } while (((uVar5 >> 3) + 2 & 0xfffffffffffffffe) != uVar7);
    }
  }
  this->current_size_ = new_size;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&elements()[current_size_], &elements()[new_size], value);
  }
  current_size_ = new_size;
}